

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O2

void __thiscall
ElementsConfidentialAddress_P2wpkhAddressFromString_Test::
ElementsConfidentialAddress_P2wpkhAddressFromString_Test
          (ElementsConfidentialAddress_P2wpkhAddressFromString_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00705f98;
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2wpkhAddressFromString) {
  ElementsConfidentialAddress address;

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "el1qqtrrepq74crfxf3xzx8804qq9w4pgkf2a2l9gwwtughqv4p3nk8gepg0y9q39qhjgmnyfwfz5z5c5ek0llwtc3jfqw5zvqx5q")));
  EXPECT_STREQ(
      "el1qqtrrepq74crfxf3xzx8804qq9w4pgkf2a2l9gwwtughqv4p3nk8gepg0y9q39qhjgmnyfwfz5z5c5ek0llwtc3jfqw5zvqx5q",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02c63c841eae06932626118e77d4002baa14592aeabe5439cbe22e0654319d8e8c",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("850f21411282f246e644b922a0a98a66cfffdcbc",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("ert1qs58jzsgjsteydejyhy32p2v2vm8llh9uns6d93",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_STREQ("0014850f21411282f246e644b922a0a98a66cfffdcbc",
               address.GetLockingScript().GetHex().c_str());
}